

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

void __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::UpdateTree
          (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  pointer *ppiVar1;
  pointer piVar2;
  pointer piVar3;
  int BlockNum;
  long lVar4;
  long lVar5;
  int iVar6;
  string local_70;
  string local_50;
  
  piVar2 = (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar3 = (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_50,(string *)&this->Index_FileName);
  BlockNum = Buffer::Find(&blocks,&local_50,0);
  std::__cxx11::string::~string((string *)&local_50);
  if (BlockNum == -1) {
    std::__cxx11::string::string((string *)&local_70,(string *)&this->Index_FileName);
    BlockNum = Buffer::Allocate(&blocks,&local_70,0);
    std::__cxx11::string::~string((string *)&local_70);
  }
  lVar4 = (long)BlockNum;
  blocks.buffer[lVar4].data[0] = this->Data_Type;
  *(int *)(blocks.buffer[lVar4].data + 1) = this->N;
  *(int *)(blocks.buffer[lVar4].data + 5) = (this->RootAddr).FileOff;
  *(int *)(blocks.buffer[lVar4].data + 9) = this->Current_Off;
  iVar6 = (int)((ulong)((long)piVar2 - (long)piVar3) >> 2);
  *(int *)(blocks.buffer[lVar4].data + 0xd) = iVar6;
  for (lVar5 = 0; ((int)(uint)lVar5 < iVar6 && ((uint)lVar5 < 1000)); lVar5 = lVar5 + 1) {
    *(int *)(lVar4 * 0x2028 + 0x1543ad + lVar5 * 4) =
         (this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish[-1];
    ppiVar1 = &(this->FileOff_bin).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppiVar1 = *ppiVar1 + -1;
  }
  Buffer::Lock(&blocks,BlockNum);
  return;
}

Assistant:

void BpTree<K>::UpdateTree(void) {
	int i, s = this->FileOff_bin.size();
	int BlockNum = blocks.Find(this->Index_FileName, 0);
	if (BlockNum == -1) {
		BlockNum = blocks.Allocate(this->Index_FileName, 0);
	}
	char* p = blocks.buffer[BlockNum].data;
	memcpy(p, &this->Data_Type, sizeof(char));
	p += sizeof(char);
	memcpy(p, reinterpret_cast<char*>(&this->N), sizeof(int));
	p += sizeof(int);
	memcpy(p, reinterpret_cast<char*>(&this->RootAddr.FileOff), sizeof(int));
	p += sizeof(int);
	memcpy(p, reinterpret_cast<char*>(&this->Current_Off), sizeof(int));
	p += sizeof(int);
	memcpy(p, reinterpret_cast<char*>(&s), sizeof(int));
	p += sizeof(int);
	for (i = 0; i < s && i < 1000; i++) {
		memcpy(p, reinterpret_cast<char*>(&this->FileOff_bin.back()), sizeof(int));
		p += sizeof(int);
		this->FileOff_bin.pop_back();
	}
	blocks.Lock(BlockNum);
}